

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O0

void __thiscall DCFGReader::~DCFGReader(DCFGReader *this)

{
  DCFGReader *this_local;
  
  (this->super_CFGReader)._vptr_CFGReader = (_func_int **)&PTR__DCFGReader_00171a70;
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->m_visited);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->m_entries);
  std::
  map<unsigned_long,_DCFGReader::Symbol,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DCFGReader::Symbol>_>_>
  ::~map(&this->m_symbols);
  std::__cxx11::list<DCFGReader::Routine,_std::allocator<DCFGReader::Routine>_>::~list
            (&this->m_routines);
  std::
  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
  ::~map(&this->m_edges);
  std::
  map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
  ::~map(&this->m_nodes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_filenames);
  CFGReader::~CFGReader(&this->super_CFGReader);
  return;
}

Assistant:

DCFGReader::~DCFGReader() {
}